

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_merger.cpp
# Opt level: O2

void __thiscall duckdb::ARTMerger::MergePrefixes(ARTMerger *this,NodeEntry *entry)

{
  byte bVar1;
  Node *pNVar2;
  reference<Node> this_00;
  uint8_t byte;
  uint8_t byte_00;
  GateStatus status;
  byte pos;
  uint8_t pos_00;
  idx_t i;
  idx_t iVar3;
  reference<Node> ref;
  optional_idx local_70;
  Prefix l_prefix;
  Prefix r_prefix;
  Node l_child;
  
  iVar3 = 0;
  Prefix::Prefix(&l_prefix,this->art,(Node)(entry->left->super_IndexPointer).data,true,false);
  Prefix::Prefix(&r_prefix,this->art,(Node)(entry->right->super_IndexPointer).data,true,false);
  bVar1 = this->art->prefix_count;
  pos = r_prefix.data[bVar1];
  if (l_prefix.data[bVar1] < r_prefix.data[bVar1]) {
    pos = l_prefix.data[bVar1];
  }
  do {
    if (pos == iVar3) {
LAB_01937c3e:
      if (l_prefix.data[bVar1] == r_prefix.data[bVar1]) {
        iVar3 = ((r_prefix.ptr)->super_IndexPointer).data;
        ((r_prefix.ptr)->super_IndexPointer).data = 0;
        Node::Free(this->art,entry->right);
        (entry->right->super_IndexPointer).data = iVar3;
        Emplace(this,l_prefix.ptr,entry->right,entry->status,
                (ulong)l_prefix.data[bVar1] + entry->depth);
      }
      else {
        if (r_prefix.data[bVar1] == pos) {
          pNVar2 = entry->right;
          iVar3 = (entry->left->super_IndexPointer).data;
          (entry->left->super_IndexPointer).data = (pNVar2->super_IndexPointer).data;
          (pNVar2->super_IndexPointer).data = iVar3;
          l_prefix.ptr = r_prefix.ptr;
        }
        MergeNodeAndPrefix(this,l_prefix.ptr,entry->right,entry->status,entry->depth + (ulong)pos,
                           pos);
      }
      return;
    }
    if (l_prefix.data[iVar3] != r_prefix.data[iVar3]) {
      optional_idx::optional_idx((optional_idx *)&ref,iVar3);
      local_70.index = (idx_t)ref._M_data;
      if (ref._M_data != (Node *)0xffffffffffffffff) {
        iVar3 = optional_idx::GetIndex(&local_70);
        pos_00 = (uint8_t)iVar3;
        byte = Prefix::GetByte(this->art,entry->left,pos_00);
        byte_00 = Prefix::GetByte(this->art,entry->right,pos_00);
        ref._M_data = entry->left;
        l_child.super_IndexPointer.data = (IndexPointer)0;
        status = Prefix::Split(this->art,&ref,&l_child,pos_00);
        Prefix::Reduce(this->art,entry->right,iVar3 & 0xff);
        this_00 = ref;
        BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(this->art,ref._M_data);
        Node::SetGateStatus(this_00._M_data,status);
        Node4::InsertChild(this->art,this_00._M_data,byte,l_child);
        Node4::InsertChild(this->art,this_00._M_data,byte_00,
                           (Node)(entry->right->super_IndexPointer).data);
        (entry->right->super_IndexPointer).data = 0;
        return;
      }
      goto LAB_01937c3e;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void ARTMerger::MergePrefixes(NodeEntry &entry) {
	D_ASSERT(entry.left.GetType() == NType::PREFIX);
	D_ASSERT(entry.right.GetType() == NType::PREFIX);

	// We traverse prefixes until we
	// Case 1: find a position where they differ.
	// Case 2: find that they are the same.
	// Case 3: find that one prefix contains the other.

	// Until we reach one of these cases, we keep reducing
	// the right prefix (and freeing the fully reduced nodes).
	// We can do so because up to any of these three cases,
	// the prefixes are the same. That means, we only need to keep
	// one of them around.

	Prefix l_prefix(art, entry.left, true);
	Prefix r_prefix(art, entry.right, true);
	const auto count = Prefix::Count(art);

	// Find a byte at pos where the prefixes differ.
	// If they match up to max_count, then pos stays invalid.
	const auto max_count = MinValue(l_prefix.data[count], r_prefix.data[count]);
	optional_idx pos;
	for (idx_t i = 0; i < max_count; i++) {
		if (l_prefix.data[i] != r_prefix.data[i]) {
			pos = i;
			break;
		}
	}

	if (pos.IsValid()) {
		// The prefixes differ at pos.
		// We split the left prefix, and reduce the right prefix.
		// Then, we insert both remainders into a new Node4.
		// Then, we are done.
		const auto cast_pos = UnsafeNumericCast<uint8_t>(pos.GetIndex());
		const auto l_byte = Prefix::GetByte(art, entry.left, cast_pos);
		const auto r_byte = Prefix::GetByte(art, entry.right, cast_pos);

		// Split and reduce.
		reference<Node> ref(entry.left);
		Node l_child;
		const auto status = Prefix::Split(art, ref, l_child, cast_pos);
		Prefix::Reduce(art, entry.right, cast_pos);

		Node4::New(art, ref);
		ref.get().SetGateStatus(status);

		Node4::InsertChild(art, ref, l_byte, l_child);
		Node4::InsertChild(art, ref, r_byte, entry.right);
		entry.right.Clear();
		return;
	}

	if (l_prefix.data[count] == r_prefix.data[count]) {
		// The prefixes match.
		// Free the right prefix, but keep the reference to its child alive.
		// Then, iterate on the left and right (reduced) child.
		auto r_child = *r_prefix.ptr;
		r_prefix.ptr->Clear();
		Node::Free(art, entry.right);
		entry.right = r_child;

		auto depth = entry.depth + l_prefix.data[count];
		Emplace(*l_prefix.ptr, entry.right, entry.status, depth);
		return;
	}

	// max_count indexes the byte after the exhausted prefix in a child node.
	if (r_prefix.data[count] == max_count) {
		// We exhausted the right prefix.
		// Ensure that we continue merging into left.
		swap(entry.left, entry.right);
		MergeNodeAndPrefix(*r_prefix.ptr, entry.right, entry.status, entry.depth + max_count, max_count);
		return;
	}

	// We exhausted the left prefix.
	MergeNodeAndPrefix(*l_prefix.ptr, entry.right, entry.status, entry.depth + max_count, max_count);
}